

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdGetPsbtByteDataList
              (void *handle,void *psbt_handle,int kind,uint32_t index,uint32_t *list_num,
              void **data_list_handle)

{
  Psbt *this;
  void *pvVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  CfdException *pCVar2;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_68;
  int local_4c;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_48;
  
  local_4c = kind;
  cfd::Initialize();
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if (data_list_handle == (void **)0x0) {
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x7b8;
    local_78._M_allocated_capacity = 0x5f5f90;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"data_list_handle is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. data_list_handle is null.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (list_num == (uint32_t *)0x0) {
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x7be;
    local_78._M_allocated_capacity = 0x5f5f90;
    cfd::core::logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"list_num is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. list_num is null.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(Psbt **)((long)psbt_handle + 0x18);
  if (this == (Psbt *)0x0) {
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x7c4;
    local_78._M_allocated_capacity = 0x5f5f90;
    cfd::core::logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"psbt is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_88);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(local_4c) {
  case 5:
    cfd::core::Psbt::GetTxInFinalScript(&local_48,this,index,true);
    break;
  case 6:
    cfd::core::Psbt::GetTxInRecordKeyList(&local_48,this,index);
    break;
  case 7:
    cfd::core::Psbt::GetTxOutRecordKeyList(&local_48,this,index);
    break;
  case 8:
    cfd::core::Psbt::GetGlobalRecordKeyList(&local_48,this);
    break;
  default:
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x7d9;
    local_78._M_allocated_capacity = 0x5f5f90;
    cfd::core::logger::log<int&>
              ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"kind is invalid: {}",&local_4c);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. kind is invalid.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_78._M_allocated_capacity =
       (size_type)
       local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._8_8_ =
       local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._0_8_ =
       local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_88);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_48);
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"PsbtDataList","");
  pvVar1 = cfd::capi::AllocBuffer((string *)local_88,0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)operator_new(0x18);
  (this_00->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> **)((long)pvVar1 + 0x10) =
       this_00;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (this_00,&local_68);
  *list_num = (int)((ulong)((long)local_68.
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  *data_list_handle = pvVar1;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_68);
  return 0;
}

Assistant:

int CfdGetPsbtByteDataList(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    uint32_t* list_num, void** data_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtByteDataListHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (data_list_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "data_list_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. data_list_handle is null.");
    }
    if (list_num == nullptr) {
      warn(CFD_LOG_SOURCE, "list_num is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. list_num is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::vector<ByteData> data_list;
    switch (kind) {
      case kCfdPsbtRecordFinalWitness:
        data_list = psbt_obj->psbt->GetTxInFinalScript(index, true);
        break;
      case kCfdPsbtRecordInputUnknownKeys:
        data_list = psbt_obj->psbt->GetTxInRecordKeyList(index);
        break;
      case kCfdPsbtRecordOutputUnknownKeys:
        data_list = psbt_obj->psbt->GetTxOutRecordKeyList(index);
        break;
      case kCfdPsbtRecordGlobalUnknownKeys:
        data_list = psbt_obj->psbt->GetGlobalRecordKeyList();
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    buffer = static_cast<CfdCapiPsbtByteDataListHandle*>(AllocBuffer(
        kPrefixPsbtByteDataList, sizeof(CfdCapiPsbtByteDataListHandle)));
    buffer->data_list = new std::vector<ByteData>();
    *(buffer->data_list) = data_list;
    *list_num = static_cast<uint32_t>(data_list.size());
    *data_list_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtByteDataList(handle, buffer);
  return result;
}